

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorTiled::Tile::GenerateGeometry
          (Tile *this,Mesh *mesh,ComputedValues *computed,Vector2f surface_origin,
          Vector2f surface_dimensions,Vector2f tile_dimensions)

{
  Vector2f VVar1;
  Type TVar2;
  Colourb CVar3;
  Vector2f VVar4;
  Vector2f VVar5;
  int i;
  long lVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Vector2f tile_offset;
  Vector2f scaled_texcoords [2];
  Vector2f tile_position;
  Vector2f local_88;
  undefined8 local_80;
  Vector2f local_78;
  Vector2f VStack_70;
  Vector2f local_60;
  float local_58;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 local_38 [16];
  Vector2f local_28;
  
  fVar8 = tile_dimensions.y;
  local_60 = surface_dimensions;
  VVar5 = local_60;
  local_60.x = surface_dimensions.x;
  if (local_60.x <= 0.0) {
    return;
  }
  local_60.y = surface_dimensions.y;
  if (local_60.y <= 0.0) {
    return;
  }
  if (this->tile_data_calculated != true) {
    return;
  }
  CVar3 = (computed->rare).image_color;
  fVar10 = (float)((uint)CVar3 >> 0x18) * (computed->inherited).opacity;
  fVar11 = fVar10 / 255.0;
  local_78.x = 0.0;
  local_78.y = 0.0;
  VStack_70.x = 0.0;
  VStack_70.y = 0.0;
  VVar1 = (this->tile_data).texcoords[0];
  fVar12 = (this->tile_data).texcoords[1].x;
  fVar15 = (this->tile_data).texcoords[1].y;
  fVar9 = (this->tile_data).texcoords[0].x;
  fVar13 = (this->tile_data).texcoords[0].y;
  lVar6 = (ulong)this->orientation * 0x10;
  lVar7 = 0;
  do {
    VVar4.y = *(float *)(lVar6 + 0x2d7a84 + lVar7 * 8) * (fVar15 - VVar1.y) + fVar13;
    VVar4.x = *(float *)(oriented_texcoords + lVar7 * 8 + lVar6) * (fVar12 - VVar1.x) + fVar9;
    (&local_78)[lVar7] = VVar4;
    lVar7 = lVar7 + 1;
  } while (lVar7 == 1);
  local_88.x = 0.0;
  local_88.y = 0.0;
  fVar12 = 1.0;
  fVar15 = 1.0;
  fVar9 = tile_dimensions.x;
  local_60 = VVar5;
  switch(this->fit_mode) {
  case FILL:
    local_88 = surface_dimensions;
    break;
  case CONTAIN:
    fVar12 = local_60.y / fVar8;
    if (local_60.x / fVar9 <= local_60.y / fVar8) {
      fVar12 = local_60.x / fVar9;
    }
    goto LAB_00211eab;
  case COVER:
    fVar12 = local_60.y / fVar8;
    if (local_60.y / fVar8 <= local_60.x / fVar9) {
      fVar12 = local_60.x / fVar9;
    }
LAB_00211eab:
    tile_dimensions.x = fVar9 * fVar12;
    tile_dimensions.y = fVar12 * fVar8;
  case SCALE_NONE:
    goto switchD_00211e46_caseD_3;
  case SCALE_DOWN:
    fVar12 = local_60.y / fVar8;
    if (local_60.x / fVar9 <= local_60.y / fVar8) {
      fVar12 = local_60.x / fVar9;
    }
    if (fVar12 < 1.0) {
      tile_dimensions.x = fVar9 * fVar12;
      tile_dimensions.y = fVar8 * fVar12;
    }
    goto switchD_00211e46_caseD_3;
  case REPEAT:
    fVar12 = local_60.x / fVar9;
    fVar15 = local_60.y / fVar8;
    local_88 = surface_dimensions;
    break;
  case REPEAT_X:
    local_88.y = fVar8;
    local_88.x = local_60.x;
    local_48 = local_60.x / fVar9;
    fStack_44 = 1.0;
    goto LAB_00211ec4;
  case REPEAT_Y:
    local_88.y = local_60.y;
    local_88.x = fVar9;
    fStack_44 = local_60.y / fVar8;
    local_48 = 1.0;
    goto LAB_00211ec4;
  }
  local_80 = 0;
  fVar8 = surface_origin.x;
  fVar9 = surface_origin.y;
LAB_00212048:
  local_78.y = local_78.y * fVar15;
  local_78.x = local_78.x * fVar12;
  VStack_70.y = fVar15 * VStack_70.y;
  VStack_70.x = VStack_70.x * fVar12;
  local_28.x = (float)local_80 + fVar8;
  local_28.y = (float)((ulong)local_80 >> 0x20) + fVar9;
  Math::SnapToPixelGrid(&local_28,&local_88);
  MeshUtilities::GenerateQuad
            (mesh,local_28,local_88,
             (ColourbPremultiplied)
             ((int)((float)((uint)CVar3 & 0xff) * fVar11) & 0xffU |
             ((int)((float)((uint)CVar3 >> 8 & 0xff) * fVar11) & 0xffU) << 8 |
             ((int)((float)((uint)CVar3 >> 0x10 & 0xff) * fVar11) & 0xffU) << 0x10 |
             (int)fVar10 << 0x18),local_78,VStack_70);
  return;
switchD_00211e46_caseD_3:
  local_88 = tile_dimensions;
  local_48 = 1.0;
  fStack_44 = 1.0;
LAB_00211ec4:
  local_38._8_4_ = in_XMM0_Dc;
  local_38._0_8_ = surface_origin;
  local_38._12_4_ = in_XMM0_Dd;
  local_80 = 0;
  lVar6 = 0;
  do {
    TVar2 = (&this->align[0].type)[lVar6 * 2];
    if (TVar2 == Percentage) {
      fVar8 = (*(float *)((long)&local_60.x + lVar6) - *(float *)((long)&local_88.x + lVar6)) *
              *(float *)((long)&this->align[0].value + lVar6 * 2) * 0.01;
LAB_00211f07:
      *(float *)((long)&local_80 + lVar6) = fVar8;
    }
    else if (TVar2 == Length) {
      fVar8 = *(float *)((long)&this->align[0].value + lVar6 * 2);
      goto LAB_00211f07;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 == 4);
  uStack_40 = 0;
  uStack_3c = 0;
  local_58 = Math::Round((float)local_80);
  fVar8 = Math::Round(local_80._4_4_);
  local_80 = CONCAT44(fVar8,local_58);
  lVar6 = 0;
  do {
    fVar8 = *(float *)((long)&local_80 + lVar6 * 4);
    fVar12 = 0.0;
    if (0.0 <= -fVar8) {
      fVar12 = -fVar8;
    }
    fVar15 = (&local_88.x)[lVar6];
    fVar13 = (fVar8 + fVar15) - (&local_60.x)[lVar6];
    fVar9 = 0.0;
    if (0.0 <= fVar13) {
      fVar9 = fVar13;
    }
    if ((0.0 < fVar12) || (0.0 < fVar9)) {
      fVar13 = (&VStack_70.x)[lVar6];
      fVar14 = fVar13 - (&local_78.x)[lVar6];
      (&local_78.x)[lVar6] = (fVar12 / fVar15) * fVar14 + (&local_78.x)[lVar6];
      (&VStack_70.x)[lVar6] = fVar13 - (fVar9 / fVar15) * fVar14;
      (&local_88.x)[lVar6] = fVar15 - (fVar12 + fVar9);
      *(float *)((long)&local_80 + lVar6 * 4) = fVar8 + fVar12;
    }
    lVar6 = lVar6 + 1;
    fVar8 = (float)local_38._0_4_;
    fVar9 = (float)local_38._4_4_;
    fVar12 = local_48;
    fVar15 = fStack_44;
  } while (lVar6 == 1);
  goto LAB_00212048;
}

Assistant:

void DecoratorTiled::Tile::GenerateGeometry(Mesh& mesh, const ComputedValues& computed, const Vector2f surface_origin,
	const Vector2f surface_dimensions, const Vector2f tile_dimensions) const
{
	if (surface_dimensions.x <= 0 || surface_dimensions.y <= 0)
		return;

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	if (!tile_data_calculated)
		return;

	// Generate the oriented texture coordinates for the tiles.
	Vector2f scaled_texcoords[2];
	for (int i = 0; i < 2; i++)
	{
		scaled_texcoords[i] = tile_data.texcoords[0] + oriented_texcoords[orientation][i] * (tile_data.texcoords[1] - tile_data.texcoords[0]);
	}

	Vector2f final_tile_dimensions;
	bool offset_and_clip_tile = false;
	Vector2f repeat_factor = Vector2f(1);

	switch (fit_mode)
	{
	case FILL:
	{
		final_tile_dimensions = surface_dimensions;
	}
	break;
	case CONTAIN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * min_factor;

		offset_and_clip_tile = true;
	}
	break;
	case COVER:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float max_factor = std::max(scale_factor.x, scale_factor.y);
		final_tile_dimensions = tile_dimensions * max_factor;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_NONE:
	{
		final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case SCALE_DOWN:
	{
		Vector2f scale_factor = surface_dimensions / tile_dimensions;
		float min_factor = std::min(scale_factor.x, scale_factor.y);
		if (min_factor < 1.0f)
			final_tile_dimensions = tile_dimensions * min_factor;
		else
			final_tile_dimensions = tile_dimensions;

		offset_and_clip_tile = true;
	}
	break;
	case REPEAT:
		final_tile_dimensions = surface_dimensions;
		repeat_factor = surface_dimensions / tile_dimensions;
		break;
	case REPEAT_X:
		final_tile_dimensions = Vector2f(surface_dimensions.x, tile_dimensions.y);
		repeat_factor.x = surface_dimensions.x / tile_dimensions.x;
		offset_and_clip_tile = true;
		break;
	case REPEAT_Y:
		final_tile_dimensions = Vector2f(tile_dimensions.x, surface_dimensions.y);
		repeat_factor.y = surface_dimensions.y / tile_dimensions.y;
		offset_and_clip_tile = true;
		break;
	}

	Vector2f tile_offset(0, 0);

	if (offset_and_clip_tile)
	{
		// Offset tile along each dimension.
		for (int i = 0; i < 2; i++)
		{
			switch (align[i].type)
			{
			case Style::LengthPercentage::Length: tile_offset[i] = align[i].value; break;
			case Style::LengthPercentage::Percentage:
				tile_offset[i] = (surface_dimensions[i] - final_tile_dimensions[i]) * align[i].value * 0.01f;
				break;
			}
		}
		tile_offset = tile_offset.Round();

		// Clip tile. See if our tile extends outside the boundary at either side, along each dimension.
		for (int i = 0; i < 2; i++)
		{
			// Left/right acts as top/bottom during the second iteration.
			float overshoot_left = std::max(-tile_offset[i], 0.0f);
			float overshoot_right = std::max(tile_offset[i] + final_tile_dimensions[i] - surface_dimensions[i], 0.0f);

			if (overshoot_left > 0.f || overshoot_right > 0.f)
			{
				float& left = scaled_texcoords[0][i];
				float& right = scaled_texcoords[1][i];
				float width = right - left;

				left += overshoot_left / final_tile_dimensions[i] * width;
				right -= overshoot_right / final_tile_dimensions[i] * width;

				final_tile_dimensions[i] -= overshoot_left + overshoot_right;
				tile_offset[i] += overshoot_left;
			}
		}
	}

	scaled_texcoords[0] *= repeat_factor;
	scaled_texcoords[1] *= repeat_factor;

	// Generate the vertices for the tiled surface.
	Vector2f tile_position = (surface_origin + tile_offset);
	Math::SnapToPixelGrid(tile_position, final_tile_dimensions);

	MeshUtilities::GenerateQuad(mesh, tile_position, final_tile_dimensions, quad_colour, scaled_texcoords[0], scaled_texcoords[1]);
}